

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O2

int CoreWvsnprintf(CPalThread *pthrCurrent,LPWSTR Buffer,size_t Count,LPCWSTR Format,
                  __va_list_tag *aparg)

{
  LPCSTR lpMultiByteStr;
  FILE *pFVar1;
  WCHAR WVar2;
  BOOL BVar3;
  uint uVar4;
  errno_t eVar5;
  int iVar6;
  uint uVar7;
  int cchWideChar;
  DWORD DVar8;
  short *psVar9;
  CPalThread *lpWideCharStr;
  undefined8 *puVar10;
  uint *puVar11;
  size_t sVar12;
  int *piVar13;
  ulong uVar14;
  undefined2 *puVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  CPalThread *lpWideCharStr_00;
  long in_FS_OFFSET;
  bool bVar19;
  _func_int **pp_Stack_4d8;
  va_list apcopy;
  int local_4b0;
  int local_4ac;
  INT Prefix;
  LPCWSTR Fmt;
  uint local_498;
  WCHAR TempWChar [2];
  INT Type;
  LPWSTR BufferPtr;
  uint local_47c;
  PVOID pvStack_478;
  INT Flags;
  CPalThread *local_470;
  CPalThread *local_468;
  int local_460;
  uint local_45c;
  INT Width;
  INT Precision;
  va_list ap;
  CHAR local_438 [8];
  CHAR TempBuff [1024];
  
  TempBuff._1016_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  _Prefix = Format;
  _Type = (CPalThread *)Buffer;
  if (!PAL_InitializeChakraCoreCalled) {
LAB_0011b8d2:
    abort();
  }
  ap[0].overflow_arg_area = aparg->reg_save_area;
  _Width = *(_func_int ***)aparg;
  ap[0]._0_8_ = aparg->overflow_arg_area;
  iVar16 = (int)Count;
  TempWChar[0] = L'\0';
  TempWChar[1] = L'\0';
  uVar7 = 0;
  BufferPtr = Buffer;
  pvStack_478 = (PVOID)Count;
LAB_0011ae41:
  do {
    local_470 = (CPalThread *)((long)_Type - (long)Buffer);
    lVar18 = (long)local_470 >> 1;
    uVar17 = Count - lVar18;
    local_468 = _Type;
    if (0x3fffffff < uVar17) {
      uVar17 = 0x40000000;
    }
    do {
      WVar2 = *_Prefix;
      if (WVar2 == L'\0') {
LAB_0011b6ad:
        if (lVar18 < iVar16) {
          *(undefined2 *)&((__va_list_tag *)&local_468->_vptr_CPalThread)->gp_offset = 0;
        }
        if (uVar7 == 0) {
          iVar16 = (int)((ulong)local_470 >> 1);
          goto LAB_0011b6e0;
        }
        piVar13 = __errno_location();
        *piVar13 = 0x22;
        goto LAB_0011b6d1;
      }
      if ((uVar7 != 0) || (iVar16 <= lVar18)) {
        uVar7 = 1;
        goto LAB_0011b6ad;
      }
      if (WVar2 != L'%') {
LAB_0011b107:
        _Prefix = _Prefix + 1;
        _Type = (CPalThread *)
                ((long)&((__va_list_tag *)&local_468->_vptr_CPalThread)->gp_offset + 2);
        *(WCHAR *)&((__va_list_tag *)&local_468->_vptr_CPalThread)->gp_offset = WVar2;
        uVar7 = 0;
        Count = (size_t)pvStack_478;
        Buffer = BufferPtr;
        goto LAB_0011ae41;
      }
      BVar3 = Internal_ExtractFormatW
                        (pthrCurrent,(LPCWSTR *)&Prefix,local_438,(LPINT)&local_47c,&local_460,
                         (LPINT)&local_45c,&local_4b0,(LPINT)&local_498);
      Count = (size_t)pvStack_478;
      Buffer = BufferPtr;
      iVar6 = local_4b0;
      if (BVar3 == 0) {
        WVar2 = *_Prefix;
        goto LAB_0011b107;
      }
      uVar7 = local_498;
      if ((local_4b0 != 4) && (local_4b0 != 2)) {
        bVar19 = local_4b0 == 1;
        if (bVar19 && local_498 == 2) {
          uVar7 = 2;
        }
        else {
          if (local_498 != 3) goto LAB_0011af4f;
          uVar7 = 3;
          if ((local_47c & 4) == 0) {
LAB_0011afc1:
            apcopy[0].overflow_arg_area = ap[0].overflow_arg_area;
            pp_Stack_4d8 = _Width;
            apcopy[0].gp_offset = ap[0].gp_offset;
            apcopy[0].fp_offset = ap[0].fp_offset;
            uVar4 = vsnprintf((char *)local_468,uVar17,local_438,&pp_Stack_4d8);
            pthrCurrent = (CPalThread *)&Width;
            PAL_printf_arg_remover((va_list *)pthrCurrent,local_460,local_45c,uVar7,iVar6);
            goto LAB_0011b07b;
          }
        }
LAB_0011b243:
        if (local_460 == -3) {
          if ((uint)Width < 0x29) {
            _Width = (_func_int **)CONCAT44(Precision,Width + 8);
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          iVar6 = -3;
        }
        else {
          iVar6 = local_460;
          if (local_460 == -2) {
            uVar17 = (ulong)_Width & 0xffffffff;
            if (uVar17 < 0x29) {
              _Width = (_func_int **)CONCAT44(Precision,Width + 8);
              piVar13 = (int *)(uVar17 + (long)ap[0].overflow_arg_area);
            }
            else {
              piVar13 = (int *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            iVar6 = *piVar13;
            local_460 = iVar6;
          }
        }
        if (local_45c == 0xfffffffc) {
          if ((uint)Width < 0x29) {
            _Width = (_func_int **)CONCAT44(Precision,Width + 8);
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          uVar4 = 0xfffffffc;
        }
        else {
          uVar4 = local_45c;
          if (local_45c == 0xfffffffe) {
            uVar17 = (ulong)_Width & 0xffffffff;
            if (uVar17 < 0x29) {
              _Width = (_func_int **)CONCAT44(Precision,Width + 8);
              puVar11 = (uint *)(uVar17 + (long)ap[0].overflow_arg_area);
            }
            else {
              puVar11 = (uint *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            local_45c = *puVar11;
            TempWChar[0] = L'\x01';
            TempWChar[1] = L'\0';
            uVar4 = local_45c;
          }
        }
        uVar17 = (ulong)_Width & 0xffffffff;
        local_468 = (CPalThread *)
                    CONCAT71(local_468._1_7_,local_4b0 == 4 || local_4b0 == 2 && uVar7 == 2);
        if (local_4b0 == 4 || local_4b0 == 2 && uVar7 == 2) {
          if ((uint)Width < 0x29) {
            _Width = (_func_int **)CONCAT44(Precision,Width + 8);
            puVar10 = (undefined8 *)(uVar17 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar10 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          lpWideCharStr = (CPalThread *)*puVar10;
        }
        else {
          if ((uint)Width < 0x29) {
            _Width = (_func_int **)CONCAT44(Precision,Width + 8);
            puVar10 = (undefined8 *)(uVar17 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar10 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          lpMultiByteStr = (LPCSTR)*puVar10;
          cchWideChar = MultiByteToWideChar(0,0,lpMultiByteStr,-1,(LPWSTR)0x0,0);
          if (cchWideChar == 0) {
            fprintf(_stderr,"] %s %s:%d","CoreWvsnprintf",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                    ,0x7ae);
            fprintf(_stderr,"Unable to convert from multibyte  to wide char.\n");
            goto LAB_0011b6d1;
          }
          lpWideCharStr = (CPalThread *)CorUnix::InternalMalloc((ulong)(cchWideChar + 1) * 2);
          if (lpWideCharStr == (CPalThread *)0x0) {
            iVar16 = -1;
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011b8d2;
            goto LAB_0011b6e0;
          }
          MultiByteToWideChar(0,0,lpMultiByteStr,-1,(LPWSTR)lpWideCharStr,cchWideChar);
        }
        local_4ac = iVar6;
        if (TempWChar == (WCHAR  [2])0x0) {
          sVar12 = PAL_wcslen((char16_t *)lpWideCharStr);
          uVar7 = (uint)sVar12;
        }
        else {
          uVar7 = 0;
          while (((int)uVar7 <= (int)uVar4 &&
                 (*(short *)((long)&lpWideCharStr->_vptr_CPalThread + (long)(int)uVar7 * 2) != 0)))
          {
            uVar7 = uVar7 + 1;
          }
        }
        pthrCurrent = (CPalThread *)CorUnix::InternalMalloc((long)(int)(uVar7 + 1) * 2);
        if (pthrCurrent == (CPalThread *)0x0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011b8d2;
          piVar13 = __errno_location();
          *piVar13 = 8;
          if ((char)local_468 == '\0') goto LAB_0011b7d4;
          goto LAB_0011b6d1;
        }
        if (uVar4 == 0xfffffffd) {
          *(undefined2 *)&pthrCurrent->_vptr_CPalThread = 0;
          uVar7 = 0;
        }
        else if (((int)uVar4 < 1) || ((int)uVar7 <= (int)uVar4)) {
          PAL_wcscpy((char16_t *)pthrCurrent,(char16_t *)lpWideCharStr);
        }
        else {
          eVar5 = wcsncpy_s((char16_t_conflict *)pthrCurrent,(long)(int)(uVar7 + 1),
                            (char16_t_conflict *)lpWideCharStr,(ulong)uVar4);
          uVar7 = uVar4;
          if (eVar5 != 0) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011b8d2;
            if ((char)local_468 == '\0') {
              CorUnix::InternalFree(lpWideCharStr);
            }
            CorUnix::InternalFree(pthrCurrent);
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011b8d2;
            goto LAB_0011b6d1;
          }
        }
        uVar7 = Internal_AddPaddingW
                          ((LPWSTR *)&Type,(int)pvStack_478 - (int)((ulong)local_470 >> 1),
                           (LPWSTR)pthrCurrent,local_4ac - uVar7,local_47c);
        if ((char)local_468 == '\0') {
          CorUnix::InternalFree(lpWideCharStr);
        }
        uVar7 = uVar7 ^ 1;
        goto LAB_0011b5f1;
      }
      if ((local_498 & 0xfffffffe) == 2) goto LAB_0011b243;
      if (local_498 == 1 && local_4b0 == 2) {
        uVar7 = Width;
        if (local_460 + 3U < 2) {
          if ((uint)Width < 0x29) {
            uVar7 = Width + 8;
            _Width = (_func_int **)CONCAT44(Precision,uVar7);
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if ((local_45c & 0xfffffffd) == 0xfffffffc) {
          if (uVar7 < 0x29) {
            uVar7 = uVar7 + 8;
            _Width = (_func_int **)CONCAT44(Precision,uVar7);
            goto LAB_0011b634;
          }
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
LAB_0011b655:
          puVar15 = (undefined2 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        else {
LAB_0011b634:
          if (0x28 < uVar7) goto LAB_0011b655;
          _Width = (_func_int **)CONCAT44(Precision,uVar7 + 8);
          puVar15 = (undefined2 *)((ulong)uVar7 + (long)ap[0].overflow_arg_area);
        }
        Fmt._4_2_ = *puVar15;
        Fmt._6_2_ = 0;
        pthrCurrent = (CPalThread *)&Type;
        uVar7 = Internal_AddPaddingW
                          ((LPWSTR *)pthrCurrent,(int)pvStack_478 - (int)((ulong)local_470 >> 1),
                           (LPWSTR)((long)&Fmt + 4),local_460 + -1,local_47c);
        uVar7 = uVar7 ^ 1;
        goto LAB_0011ae41;
      }
      bVar19 = false;
LAB_0011af4f:
      if (local_498 == 6) {
        if (local_460 == -2) {
          uVar17 = (ulong)_Width & 0xffffffff;
          if (uVar17 < 0x29) {
            _Width = (_func_int **)CONCAT44(Precision,Width + 8);
            piVar13 = (int *)(uVar17 + (long)ap[0].overflow_arg_area);
          }
          else {
            piVar13 = (int *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          local_460 = *piVar13;
        }
        if (local_45c == 0xfffffffe) {
          uVar17 = (ulong)_Width & 0xffffffff;
          if (uVar17 < 0x29) {
            _Width = (_func_int **)CONCAT44(Precision,Width + 8);
            puVar11 = (uint *)(uVar17 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar11 = (uint *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          local_45c = *puVar11;
        }
        uVar17 = (ulong)_Width & 0xffffffff;
        if (bVar19) {
          if ((uint)Width < 0x29) {
            _Width = (_func_int **)CONCAT44(Precision,Width + 8);
            puVar10 = (undefined8 *)(uVar17 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar10 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          *(short *)*puVar10 = (short)((ulong)local_470 >> 1);
        }
        else {
          if ((uint)Width < 0x29) {
            _Width = (_func_int **)CONCAT44(Precision,Width + 8);
            puVar10 = (undefined8 *)(uVar17 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar10 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          *(int *)*puVar10 = (int)((ulong)local_470 >> 1);
        }
        uVar7 = 0;
        goto LAB_0011ae41;
      }
      pthrCurrent = local_468;
      if (local_498 != 5 || (bool)(bVar19 ^ 1U)) {
        if (local_498 != 4 || (bool)(bVar19 ^ 1U)) goto LAB_0011afc1;
        uVar14 = (ulong)_Width & 0xffffffff;
        if (uVar14 < 0x29) {
          _Width = (_func_int **)CONCAT44(Precision,Width + 8);
          psVar9 = (short *)(uVar14 + (long)ap[0].overflow_arg_area);
        }
        else {
          psVar9 = (short *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        uVar4 = snprintf((char *)local_468,uVar17,local_438,(ulong)(uint)(int)*psVar9);
      }
      else {
        uVar14 = (ulong)_Width & 0xffffffff;
        if (uVar14 < 0x29) {
          _Width = (_func_int **)CONCAT44(Precision,Width + 8);
          psVar9 = (short *)(uVar14 + (long)ap[0].overflow_arg_area);
        }
        else {
          psVar9 = (short *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        uVar4 = snprintf((char *)local_468,uVar17,local_438,(long)*psVar9);
      }
LAB_0011b07b:
      uVar14 = (ulong)uVar4;
      uVar7 = 0;
    } while (uVar4 == 0);
    if (((int)uVar4 < 0) || (uVar17 <= uVar14)) {
      lpWideCharStr = (CPalThread *)CorUnix::InternalMalloc(uVar17 + 1);
      lpWideCharStr_00 = local_468;
      if (lpWideCharStr != (CPalThread *)0x0) {
        eVar5 = strncpy_s((char *)lpWideCharStr,uVar17 + 1,(char *)local_468,uVar17);
        if (eVar5 == 0) {
          iVar6 = MultiByteToWideChar(0,0,(LPCSTR)lpWideCharStr,(int)uVar17,(LPWSTR)lpWideCharStr_00
                                      ,(int)uVar17);
          if (iVar6 != 0) {
            uVar7 = 1;
            local_470 = lpWideCharStr;
            goto LAB_0011b221;
          }
          fprintf(_stderr,"] %s %s:%d","CoreWvsnprintf",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                  ,0x87d);
          pFVar1 = _stderr;
          DVar8 = GetLastError();
          fprintf(pFVar1,"MultiByteToWideChar failed.  Error is %d\n",(ulong)DVar8);
        }
        else {
          fprintf(_stderr,"] %s %s:%d","CoreWvsnprintf",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                  ,0x870);
          fprintf(_stderr,"strncpy_s failed!\n");
        }
        goto LAB_0011b7d4;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011b8d2;
      piVar13 = __errno_location();
      *piVar13 = 0xc;
      goto LAB_0011b6d1;
    }
    lpWideCharStr = (CPalThread *)CorUnix::InternalMalloc((long)(int)(uVar4 + 1));
    lpWideCharStr_00 = local_468;
    if (lpWideCharStr == (CPalThread *)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011b8d2;
      piVar13 = __errno_location();
      *piVar13 = 8;
      goto LAB_0011b6d1;
    }
    eVar5 = strncpy_s((char *)lpWideCharStr,(long)(int)(uVar4 + 1),(char *)local_468,uVar14);
    if (eVar5 != 0) {
      fprintf(_stderr,"] %s %s:%d","CoreWvsnprintf",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
              ,0x892);
      fprintf(_stderr,"strncpy_s failed!\n");
LAB_0011b7d4:
      CorUnix::InternalFree(lpWideCharStr);
LAB_0011b6d1:
      iVar16 = -1;
LAB_0011b6e0:
      if (*(long *)(in_FS_OFFSET + 0x28) != TempBuff._1016_8_) {
        __stack_chk_fail();
      }
      return iVar16;
    }
    uVar7 = 0;
    local_470 = lpWideCharStr;
    iVar6 = MultiByteToWideChar(0,0,(LPCSTR)lpWideCharStr,uVar4,(LPWSTR)lpWideCharStr_00,uVar4);
    uVar17 = uVar14;
    if (iVar6 == 0) {
      fprintf(_stderr,"] %s %s:%d","CoreWvsnprintf",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
              ,0x89f);
      pFVar1 = _stderr;
      DVar8 = GetLastError();
      fprintf(pFVar1,"MultiByteToWideChar failed.  Error is %d\n",(ulong)DVar8);
      lpWideCharStr = local_470;
      goto LAB_0011b7d4;
    }
LAB_0011b221:
    _Type = (CPalThread *)
            ((long)&((__va_list_tag *)&lpWideCharStr_00->_vptr_CPalThread)->gp_offset + uVar17 * 2);
    pthrCurrent = local_470;
LAB_0011b5f1:
    CorUnix::InternalFree(pthrCurrent);
    Count = (size_t)pvStack_478;
    Buffer = BufferPtr;
  } while( true );
}

Assistant:

int CoreWvsnprintf(CPalThread *pthrCurrent, LPWSTR Buffer, size_t Count, LPCWSTR Format, va_list aparg)
{
    BOOL BufferRanOut = FALSE;
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    LPWSTR BufferPtr = Buffer;
    LPCWSTR Fmt = Format;
    LPWSTR TempWStr = NULL;
    LPWSTR WorkingWStr = NULL;
    WCHAR TempWChar[2];
    INT Flags;
    INT Width;
    INT Precision;
    INT Prefix;
    INT Type;
    INT TempInt;
    LPSTR TempNumberBuffer;
    int mbtowcResult;
    va_list(ap);

    PERF_ENTRY(wvsnprintf);
    ENTRY("wvsnprintf (buffer=%p, count=%u, format=%p (%S))\n",
          Buffer, Count, Format, Format);

    va_copy(ap, aparg);
    BOOL precisionSet = false;

    while (*Fmt)
    {
        if (BufferRanOut || (BufferPtr - Buffer) >= static_cast<int>(Count)) //Count is assumed to be in the range of int
        {
            BufferRanOut = TRUE;
            break;
        }
        else if(*Fmt == '%' &&
                TRUE == Internal_ExtractFormatW(pthrCurrent, &Fmt, TempBuff, &Flags,
                                                &Width, &Precision,
                                                &Prefix, &Type))
        {
            if (((Prefix == PFF_PREFIX_LONG || Prefix == PFF_PREFIX_LONG_W) &&
                (Type == PFF_TYPE_STRING || Type == PFF_TYPE_WSTRING)) ||
                (Prefix == PFF_PREFIX_SHORT && Type == PFF_TYPE_STRING) ||
                (Type == PFF_TYPE_WSTRING && (Flags & PFF_ZERO) != 0))
            {
                BOOL needToFree = FALSE;

                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                else if (WIDTH_INVALID == Width)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                    precisionSet = true;
                }
                else if (PRECISION_INVALID == Precision)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if ((Type == PFF_TYPE_STRING && Prefix == PFF_PREFIX_LONG) ||
                    Prefix == PFF_PREFIX_LONG_W)
                {
                    TempWStr = va_arg(ap, LPWSTR);
                }
                else
                {
                    // %lS and %hs assume an LPSTR argument.
                    LPSTR s = va_arg(ap, LPSTR );
                    UINT Length = 0;
                    Length = MultiByteToWideChar( CP_ACP, 0, s, -1, NULL, 0 );
                    if ( Length != 0 )
                    {
                        TempWStr =
                            (LPWSTR)InternalMalloc((Length + 1 ) * sizeof( WCHAR ) );
                        if ( TempWStr )
                        {
                            needToFree = TRUE;
                            MultiByteToWideChar( CP_ACP, 0, s, -1,
                                                 TempWStr, Length );
                        }
                        else
                        {
                            ERROR( "InternalMalloc failed.\n" );
                            va_end(ap);
                            return -1;
                        }
                    }
                    else
                    {
                        ASSERT( "Unable to convert from multibyte "
                               " to wide char.\n" );
                        va_end(ap);
                        return -1;
                    }
                }

                INT Length = 0;
                if (precisionSet)
                {
                    for(; Length <= Precision && TempWStr[Length] != 0; Length++);
                }
                else
                {
                    Length = PAL_wcslen(TempWStr);
                }

                WorkingWStr = (LPWSTR) InternalMalloc(sizeof(WCHAR) * (Length + 1));
                if (!WorkingWStr)
                {
                    ERROR("InternalMalloc failed\n");
                    pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    if (needToFree)
                    {
                        InternalFree(TempWStr);
                    }
                    va_end(ap);
                    return -1;
                }
                if (PRECISION_DOT == Precision)
                {
                    // Copy nothing
                    *WorkingWStr = 0;
                    Length = 0;
                }
                else if (Precision > 0 && Precision < Length)
                {
                    if (wcsncpy_s(WorkingWStr, (Length + 1), TempWStr, Precision) != SAFECRT_SUCCESS)
                    {
                        ERROR("CoreWvsnprintf failed\n");
                        if (needToFree)
                        {
                            InternalFree(TempWStr);
                        }
                        InternalFree(WorkingWStr);
                        LOGEXIT("wcsncpy_s failed!\n");
                        PERF_EXIT(wvsnprintf);
                        va_end(ap);
                        return (-1);
                    }
                    Length = Precision;
                }
                else
                {
                    // Copy everything
                    PAL_wcscpy(WorkingWStr, TempWStr);
                }

                // Add padding if needed.
                BufferRanOut = !Internal_AddPaddingW(&BufferPtr,
                                                   Count - (BufferPtr - Buffer),
                                                   WorkingWStr,
                                                   Width - Length,
                                                   Flags);

                if (needToFree)
                {
                    InternalFree(TempWStr);
                }
                InternalFree(WorkingWStr);
            }
            else if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_CHAR)
            {
                if (WIDTH_STAR == Width ||
                    WIDTH_INVALID == Width)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision ||
                    PRECISION_INVALID == Precision)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWChar[0] = va_arg(ap, int);
                TempWChar[1] = 0;

                /* do the padding (if needed)*/
                BufferRanOut = !Internal_AddPaddingW(&BufferPtr,
                                                   Count - (BufferPtr - Buffer),
                                                   TempWChar,
                                                   Width - 1,
                                                   Flags);

            }
            /* this places the number of bytes written to the buffer in the
               next arg */
            else if (Type == PFF_TYPE_N)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }

                if (Prefix == PFF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = BufferPtr - Buffer;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = BufferPtr - Buffer;
                }
            }
            else
            {
                // Types that sprintf can handle

                /* note: I'm using the wide buffer as a (char *) buffer when I
                   pass it to sprintf().  After I get the buffer back I make a
                   backup of the chars copied and then convert them to wide
                   and place them in the buffer (BufferPtr) */
                size_t TempCount = Count - (BufferPtr - Buffer);
                TempInt = 0;

#if !HAVE_LARGE_SNPRINTF_SUPPORT
                // Limit TempCount to 0x40000000, which is sufficient
                // for platforms on which snprintf fails for very large
                // sizes.
                if (TempCount > 0x40000000)
                {
                    TempCount = 0x40000000;
                }
#endif  // HAVE_LARGE_SNPRINTF_SUPPORT

                // %h (short) doesn't seem to be handled properly by local sprintf,
                // so we do the truncation ourselves for some cases.
                if (Type == PFF_TYPE_P && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert from pointer -> int -> short to avoid warnings.
                    long trunc1;
                    short trunc2;

                    trunc1 = va_arg(ap, LONG);
                    trunc2 = (short)trunc1;
                    trunc1 = trunc2;

                    TempInt = snprintf((LPSTR)BufferPtr, TempCount, TempBuff, trunc1);
                }
                else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert explicitly from int to short to get
                    // correct sign extension for shorts on all systems.
                    int n;
                    short s;

                    n = va_arg(ap, int);
                    s = (short) n;

                    TempInt = snprintf((LPSTR)BufferPtr, TempCount, TempBuff, s);
                }
                else
                {
                    va_list apcopy;
                    va_copy(apcopy, ap);
                    TempInt = vsnprintf((LPSTR) BufferPtr, TempCount, TempBuff, apcopy);
                    va_end(apcopy);
                    PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);
                }

                if (TempInt == 0)
                {
                    // The argument is "".
                    continue;
                }
                if (TempInt < 0 || static_cast<size_t>(TempInt) >= TempCount) /* buffer not long enough */
                {
                    TempNumberBuffer = (LPSTR) InternalMalloc(TempCount+1);
                    if (!TempNumberBuffer)
                    {
                        ERROR("InternalMalloc failed\n");
                        pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                        errno = ENOMEM;
                        va_end(ap);
                        return -1;
                    }

                    if (strncpy_s(TempNumberBuffer, TempCount+1, (LPSTR) BufferPtr, TempCount) != SAFECRT_SUCCESS)
                    {
                        ASSERT("strncpy_s failed!\n");
                        InternalFree(TempNumberBuffer);
                        va_end(ap);
                        return -1;
                    }

                    mbtowcResult = MultiByteToWideChar(CP_ACP, 0,
                                                       TempNumberBuffer,
                                                       TempCount,
                                                       BufferPtr, TempCount);
                    if (!mbtowcResult)
                    {
                        ASSERT("MultiByteToWideChar failed.  Error is %d\n",
                              GetLastError());
                        InternalFree(TempNumberBuffer);
                        va_end(ap);
                        return -1;
                    }
                    BufferPtr += TempCount;
                    BufferRanOut = TRUE;
                }
                else
                {
                    TempNumberBuffer = (LPSTR) InternalMalloc(TempInt+1);
                    if (!TempNumberBuffer)
                    {
                        ERROR("InternalMalloc failed\n");
                        pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                        va_end(ap);
                        return -1;
                    }

                    if (strncpy_s(TempNumberBuffer, TempInt+1, (LPSTR) BufferPtr, TempInt) != SAFECRT_SUCCESS)
                    {
                        ASSERT("strncpy_s failed!\n");
                        InternalFree(TempNumberBuffer);
                        va_end(ap);
                        return -1;
                    }

                    mbtowcResult = MultiByteToWideChar(CP_ACP, 0,
                                                       TempNumberBuffer,
                                                       TempInt,
                                                       BufferPtr, TempInt);
                    if (!mbtowcResult)
                    {
                        ASSERT("MultiByteToWideChar failed.  Error is %d\n",
                              GetLastError());
                        InternalFree(TempNumberBuffer);
                        va_end(ap);
                        return -1;
                    }
                    BufferPtr += TempInt;
                }
                InternalFree(TempNumberBuffer);
            }
        }
        else
        {
            *BufferPtr++ = *Fmt++; /* copy regular chars into buffer */
        }
    }

    if (static_cast<int>(Count) > (BufferPtr - Buffer)) //Count is assumed to be in the range of int
    {
        *BufferPtr = 0; /* end the string */
    }

    va_end(ap);

    if (BufferRanOut)
    {
        errno = ERANGE;
        return -1;
    }
    else
    {
        return BufferPtr - Buffer;
    }
}